

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptIntrinsics.cpp
# Opt level: O0

IntrinsicResult __thiscall
MiniScript::intrinsic_indexOf(MiniScript *this,Context *context,IntrinsicResult *partialResult)

{
  bool bVar1;
  int32_t iVar2;
  long lVar3;
  Value *lhs;
  double dVar4;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [24];
  ValueDictIterator kv;
  undefined1 local_128 [7];
  bool sawAfter;
  ValueDict dict;
  long idx;
  long afterIdx_1;
  String s;
  String str;
  long local_c0;
  long i;
  long local_b0;
  long afterIdx;
  long count;
  ValueList list;
  undefined1 local_80 [8];
  Value after;
  undefined1 local_60 [8];
  Value value;
  String local_40;
  bool local_30;
  Value self;
  IntrinsicResult *partialResult_local;
  Context *context_local;
  
  self.data = (anon_union_8_3_2f476f46_for_data)partialResult;
  String::String(&local_40,"self");
  Context::GetVar((Context *)&stack0xffffffffffffffd0,(String *)context,(LocalOnlyMode)&local_40);
  String::~String(&local_40);
  String::String((String *)&after.data,"value");
  Context::GetVar((Context *)local_60,(String *)context,(char)&after + 8);
  String::~String((String *)&after.data);
  String::String((String *)&list.isTemp,"after");
  Context::GetVar((Context *)local_80,(String *)context,(char)&list + 8);
  String::~String((String *)&list.isTemp);
  if (local_30 == true) {
    Value::GetList((Value *)&count);
    lVar3 = List<MiniScript::Value>::Count((List<MiniScript::Value> *)&count);
    local_b0 = -1;
    bVar1 = Value::IsNull((Value *)local_80);
    if (!bVar1) {
      iVar2 = Value::IntValue((Value *)local_80);
      local_b0 = (long)iVar2;
    }
    if (local_b0 < -1) {
      local_b0 = lVar3 + local_b0;
    }
    if ((local_b0 < -1) || (lVar3 + -1 < local_b0)) {
      IntrinsicResult::IntrinsicResult
                ((IntrinsicResult *)this,(IntrinsicResult *)&IntrinsicResult::Null);
      bVar1 = true;
    }
    else {
      do {
        local_c0 = local_b0 + 1;
        if (lVar3 <= local_c0) {
          bVar1 = false;
          goto LAB_001372cd;
        }
        lhs = List<MiniScript::Value>::operator[]((List<MiniScript::Value> *)&count,local_c0);
        dVar4 = Value::Equality(lhs,(Value *)local_60,0x10);
        local_b0 = local_c0;
      } while ((dVar4 != 1.0) || (NAN(dVar4)));
      Value::Value((Value *)&str.isTemp,(double)local_c0);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,(Value *)&str.isTemp,true);
      Value::~Value((Value *)&str.isTemp);
      bVar1 = true;
    }
LAB_001372cd:
    List<MiniScript::Value>::~List((List<MiniScript::Value> *)&count);
    if (bVar1) goto LAB_0013770f;
  }
  else if (local_30 == true) {
    Value::GetString((Value *)&s.isTemp);
    Value::ToString((Value *)&afterIdx_1,(Machine *)local_60);
    idx = -1;
    bVar1 = Value::IsNull((Value *)local_80);
    if (!bVar1) {
      iVar2 = Value::IntValue((Value *)local_80);
      idx = (long)iVar2;
    }
    if (idx < -1) {
      lVar3 = String::Length((String *)&s.isTemp);
      idx = lVar3 + idx;
    }
    lVar3 = String::IndexOf((String *)&s.isTemp,(String *)&afterIdx_1,idx + 1);
    if (-1 < lVar3) {
      Value::Value((Value *)&dict.isTemp,(double)lVar3);
      IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,(Value *)&dict.isTemp,true);
      Value::~Value((Value *)&dict.isTemp);
    }
    String::~String((String *)&afterIdx_1);
    String::~String((String *)&s.isTemp);
    if (-1 < lVar3) goto LAB_0013770f;
  }
  else if (local_30 == true) {
    Value::GetDict((ValueDict *)local_128,(Value *)&stack0xffffffffffffffd0);
    kv.entry._7_1_ = Value::IsNull((Value *)local_80);
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::GetIterator
              ((DictIterator<MiniScript::Value,_MiniScript::Value> *)(local_158 + 0x10),
               (Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)local_128
              );
    while (bVar1 = DictIterator<MiniScript::Value,_MiniScript::Value>::Done
                             ((DictIterator<MiniScript::Value,_MiniScript::Value> *)
                              (local_158 + 0x10)), ((bVar1 ^ 0xffU) & 1) != 0) {
      if ((kv.entry._7_1_ & 1) == 0) {
        DictIterator<MiniScript::Value,_MiniScript::Value>::Key
                  ((DictIterator<MiniScript::Value,_MiniScript::Value> *)local_158);
        dVar4 = Value::Equality((Value *)local_158,(Value *)local_80,0x10);
        Value::~Value((Value *)local_158);
        if ((dVar4 == 1.0) && (!NAN(dVar4))) {
          kv.entry._7_1_ = 1;
        }
      }
      else {
        DictIterator<MiniScript::Value,_MiniScript::Value>::Value
                  ((DictIterator<MiniScript::Value,_MiniScript::Value> *)local_168);
        dVar4 = Value::Equality((Value *)local_168,(Value *)local_60,0x10);
        Value::~Value((Value *)local_168);
        if ((dVar4 == 1.0) && (!NAN(dVar4))) {
          DictIterator<MiniScript::Value,_MiniScript::Value>::Key
                    ((DictIterator<MiniScript::Value,_MiniScript::Value> *)local_178);
          IntrinsicResult::IntrinsicResult((IntrinsicResult *)this,(Value *)local_178,true);
          Value::~Value((Value *)local_178);
          bVar1 = true;
          goto LAB_001376c4;
        }
      }
      DictIterator<MiniScript::Value,_MiniScript::Value>::Next
                ((DictIterator<MiniScript::Value,_MiniScript::Value> *)(local_158 + 0x10));
    }
    bVar1 = false;
LAB_001376c4:
    Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue>::~Dictionary
              ((Dictionary<MiniScript::Value,_MiniScript::Value,_&MiniScript::HashValue> *)local_128
              );
    if (bVar1) goto LAB_0013770f;
  }
  IntrinsicResult::IntrinsicResult
            ((IntrinsicResult *)this,(IntrinsicResult *)&IntrinsicResult::Null);
LAB_0013770f:
  Value::~Value((Value *)local_80);
  Value::~Value((Value *)local_60);
  Value::~Value((Value *)&stack0xffffffffffffffd0);
  return (IntrinsicResult)(IntrinsicResultStorage *)this;
}

Assistant:

static IntrinsicResult intrinsic_indexOf(Context *context, IntrinsicResult partialResult) {
		Value self = context->GetVar("self");
		Value value = context->GetVar("value");
		Value after = context->GetVar("after");
		if (self.type == ValueType::List) {
			ValueList list = self.GetList();
			long count = list.Count();
			long afterIdx = -1;
			if (!after.IsNull()) afterIdx = after.IntValue();
			if (afterIdx < -1) afterIdx += count;
			if (afterIdx < -1 || afterIdx > count-1) return IntrinsicResult::Null;
			for (long i=afterIdx+1; i<count; i++) {
				if (Value::Equality(list[i], value) == 1) return IntrinsicResult(i);
			}
		} else if (self.type == ValueType::String) {
			String str = self.GetString();
			String s = value.ToString();
			long afterIdx = -1;
			if (!after.IsNull()) afterIdx = after.IntValue();
			if (afterIdx < -1) afterIdx += str.Length();
			long idx = str.IndexOf(s, afterIdx+1);
			if (idx >= 0) return IntrinsicResult(idx);
		} else if (self.type == ValueType::Map) {
			ValueDict dict = self.GetDict();
			bool sawAfter = after.IsNull();
			for (ValueDictIterator kv = dict.GetIterator(); !kv.Done(); kv.Next()) {
				if (!sawAfter) {
					if (Value::Equality(kv.Key(), after) == 1) sawAfter = true;
				} else {
					if (Value::Equality(kv.Value(), value) == 1) return IntrinsicResult(kv.Key());
    			}
			}
		}
		return IntrinsicResult::Null;
	}